

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O1

int cram_add_feature(cram_container *c,cram_slice *s,cram_record *r,cram_feature *f)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  cram_feature *pcVar4;
  int iVar5;
  cram_stats *st;
  
  iVar5 = s->afeatures;
  if (iVar5 <= s->nfeatures) {
    iVar3 = 0x400;
    if (iVar5 != 0) {
      iVar3 = iVar5 * 2;
    }
    s->afeatures = iVar3;
    pcVar4 = (cram_feature *)realloc(s->features,(long)iVar3 << 4);
    s->features = pcVar4;
    if (pcVar4 == (cram_feature *)0x0) {
      return -1;
    }
  }
  iVar5 = r->nfeature;
  lVar1 = (long)iVar5 + 1;
  r->nfeature = (int32_t)lVar1;
  if ((long)iVar5 == 0) {
    r->feature = s->nfeatures;
    st = c->stats[0x1c];
    iVar5 = (f->field_0).X.pos;
  }
  else {
    st = c->stats[0x1c];
    iVar5 = (f->field_0).X.pos - s->features[r->feature + lVar1 + -2].field_0.X.pos;
  }
  cram_stats_add(st,iVar5);
  cram_stats_add(c->stats[0x1b],(f->field_0).X.code);
  pcVar4 = s->features;
  iVar5 = s->nfeatures;
  s->nfeatures = iVar5 + 1;
  uVar2 = *(undefined8 *)((long)&f->field_0 + 8);
  *(undefined8 *)&pcVar4[iVar5].field_0 = *(undefined8 *)&f->field_0;
  *(undefined8 *)((long)&pcVar4[iVar5].field_0 + 8) = uVar2;
  return 0;
}

Assistant:

static int cram_add_feature(cram_container *c, cram_slice *s,
			    cram_record *r, cram_feature *f) {
    if (s->nfeatures >= s->afeatures) {
	s->afeatures = s->afeatures ? s->afeatures*2 : 1024;
	s->features = realloc(s->features, s->afeatures*sizeof(*s->features));
	if (!s->features)
	    return -1;
    }

    if (!r->nfeature++) {
	r->feature = s->nfeatures;
	cram_stats_add(c->stats[DS_FP], f->X.pos);
    } else {
	cram_stats_add(c->stats[DS_FP],
		       f->X.pos - s->features[r->feature + r->nfeature-2].X.pos);
    }
    cram_stats_add(c->stats[DS_FC], f->X.code);

    s->features[s->nfeatures++] = *f;

    return 0;
}